

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_diag(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  size_t __n;
  size_t __n_00;
  void *__s;
  void *__s_00;
  long local_e0;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_98;
  long local_90;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x11c2,"fatal error");
  }
  if (params->ith != 0) {
    return;
  }
  lVar3 = dst->ne[0];
  if (pgVar2->ne[0] == lVar3) {
    lVar4 = dst->ne[1];
    if (pgVar2->ne[0] == lVar4) {
      if (pgVar2->ne[1] == 1) {
        lVar5 = dst->ne[2];
        if (pgVar2->ne[2] == lVar5) {
          lVar6 = dst->ne[3];
          if (pgVar2->ne[3] == lVar6) {
            if (pgVar2->nb[0] == 4) {
              if (dst->nb[0] == 4) {
                if (lVar6 < 1) {
                  return;
                }
                sVar7 = pgVar2->nb[2];
                sVar8 = pgVar2->nb[3];
                sVar9 = dst->nb[1];
                sVar10 = dst->nb[2];
                sVar11 = dst->nb[3];
                local_b0 = 4;
                local_b8 = 0;
                local_e0 = 0;
                lVar15 = 0;
                do {
                  if (0 < lVar5) {
                    local_90 = local_b8;
                    local_c8 = local_e0;
                    local_98 = local_b0;
                    lVar14 = 0;
                    do {
                      if (0 < lVar4) {
                        __s_00 = (void *)((long)dst->data + local_98);
                        pvVar12 = pgVar2->data;
                        __s = (void *)((long)dst->data + local_90);
                        lVar16 = 1;
                        __n = 0;
                        __n_00 = lVar3 * 4;
                        do {
                          __n_00 = __n_00 - 4;
                          if (lVar16 != 1) {
                            memset(__s,0,__n);
                          }
                          *(undefined4 *)((long)__s_00 + -4) =
                               *(undefined4 *)((long)pvVar12 + lVar16 * 4 + local_c8 + -4);
                          if (lVar16 < lVar3) {
                            memset(__s_00,0,__n_00);
                          }
                          lVar1 = (1 - lVar4) + lVar16;
                          lVar16 = lVar16 + 1;
                          __s_00 = (void *)((long)__s_00 + sVar9 + 4);
                          __s = (void *)((long)__s + sVar9);
                          __n = __n + 4;
                        } while (lVar1 != 1);
                      }
                      lVar14 = lVar14 + 1;
                      local_98 = local_98 + sVar10;
                      local_c8 = local_c8 + sVar7;
                      local_90 = local_90 + sVar10;
                    } while (lVar14 != lVar5);
                  }
                  lVar15 = lVar15 + 1;
                  local_b0 = local_b0 + sVar11;
                  local_e0 = local_e0 + sVar8;
                  local_b8 = local_b8 + sVar11;
                } while (lVar15 != lVar6);
                return;
              }
              pcVar13 = "nb0 == sizeof(float)";
              uVar17 = 0x11a2;
            }
            else {
              pcVar13 = "nb00 == sizeof(float)";
              uVar17 = 0x11a1;
            }
          }
          else {
            pcVar13 = "ne03 == ne3";
            uVar17 = 0x119f;
          }
        }
        else {
          pcVar13 = "ne02 == ne2";
          uVar17 = 0x119e;
        }
      }
      else {
        pcVar13 = "ne01 == 1";
        uVar17 = 0x119d;
      }
    }
    else {
      pcVar13 = "ne00 == ne1";
      uVar17 = 0x119c;
    }
  }
  else {
    pcVar13 = "ne00 == ne0";
    uVar17 = 0x119b;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar17,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void ggml_compute_forward_diag(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_diag_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}